

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracepoint_map.cpp
# Opt level: O3

MapInfo * __thiscall
HawkTracer::client::TracepointMap::get_label_info
          (MapInfo *__return_storage_ptr__,TracepointMap *this,uint64_t label)

{
  bool bVar1;
  ulong __val;
  char cVar2;
  iterator iVar3;
  mapped_type *pmVar4;
  ostream *poVar5;
  ulong uVar6;
  string *__str;
  char cVar7;
  ulong local_28;
  
  local_28 = label;
  iVar3 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>,_std::allocator<std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>,_std::allocator<std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)this,&local_28);
  __val = local_28;
  if (iVar3.
      super__Node_iterator_base<std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>,_false>
      ._M_cur == (__node_type *)0x0) {
    cVar7 = '\x01';
    if (9 < local_28) {
      uVar6 = local_28;
      cVar2 = '\x04';
      do {
        cVar7 = cVar2;
        if (uVar6 < 100) {
          cVar7 = cVar7 + -2;
          goto LAB_00110f33;
        }
        if (uVar6 < 1000) {
          cVar7 = cVar7 + -1;
          goto LAB_00110f33;
        }
        if (uVar6 < 10000) goto LAB_00110f33;
        bVar1 = 99999 < uVar6;
        uVar6 = uVar6 / 10000;
        cVar2 = cVar7 + '\x04';
      } while (bVar1);
      cVar7 = cVar7 + '\x01';
    }
LAB_00110f33:
    (__return_storage_ptr__->label)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->label).field_2;
    std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,cVar7);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((__return_storage_ptr__->label)._M_dataplus._M_p,
               (uint)(__return_storage_ptr__->label)._M_string_length,__val);
    (__return_storage_ptr__->category)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->category).field_2;
    *(undefined4 *)&(__return_storage_ptr__->category).field_2 = 0x61666564;
    *(undefined4 *)((long)&(__return_storage_ptr__->category).field_2 + 3) = 0x746c7561;
    (__return_storage_ptr__->category)._M_string_length = 7;
    (__return_storage_ptr__->category).field_2._M_local_buf[7] = '\0';
    pmVar4 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>,_std::allocator<std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>,_std::allocator<std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this,&local_28);
    std::__cxx11::string::_M_assign((string *)pmVar4);
    std::__cxx11::string::_M_assign((string *)&pmVar4->category);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Cannot find mapping for label ",0x1e);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  else {
    (__return_storage_ptr__->label)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->label).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,
               *(long *)((long)iVar3.
                               super__Node_iterator_base<std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>,_false>
                               ._M_cur + 0x10),
               *(long *)((long)iVar3.
                               super__Node_iterator_base<std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>,_false>
                               ._M_cur + 0x18) +
               *(long *)((long)iVar3.
                               super__Node_iterator_base<std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>,_false>
                               ._M_cur + 0x10));
    (__return_storage_ptr__->category)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->category).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->category,
               *(long *)((long)iVar3.
                               super__Node_iterator_base<std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>,_false>
                               ._M_cur + 0x30),
               *(long *)((long)iVar3.
                               super__Node_iterator_base<std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>,_false>
                               ._M_cur + 0x38) +
               *(long *)((long)iVar3.
                               super__Node_iterator_base<std::pair<const_unsigned_long,_HawkTracer::client::TracepointMap::MapInfo>,_false>
                               ._M_cur + 0x30));
  }
  return __return_storage_ptr__;
}

Assistant:

TracepointMap::MapInfo TracepointMap::get_label_info(uint64_t label)
{
    auto it = _input_map.find(label);

    if (it != _input_map.end())
    {
        return it->second;
    }

    MapInfo info = { std::to_string(label), category_to_string(Unknown) };
    _input_map[label] = info;

    std::cerr << "Cannot find mapping for label " << label << std::endl;
    return info;
}